

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O3

RESTResponseFormat ParseDataFormat(string *param,string *strReq)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 uVar3;
  size_type sVar4;
  long lVar5;
  RESTResponseFormat RVar6;
  size_type sVar7;
  long in_FS_OFFSET;
  string suffix;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (strReq->_M_string_length == 0) {
LAB_00289890:
    sVar4 = 0xffffffffffffffff;
  }
  else {
    sVar7 = strReq->_M_string_length;
    do {
      sVar4 = sVar7 - 1;
      if (sVar7 == 0) goto LAB_00289890;
      lVar5 = sVar7 - 1;
      sVar7 = sVar4;
    } while ((strReq->_M_dataplus)._M_p[lVar5] != '?');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,strReq,0,sVar4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (param,&local_58);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  RVar6 = UNDEF;
  if (param->_M_string_length != 0) {
    sVar7 = param->_M_string_length;
    do {
      sVar4 = sVar7;
      sVar7 = sVar4 - 1;
      RVar6 = UNDEF;
      if (sVar4 == 0) goto LAB_0028997d;
    } while ((param->_M_dataplus)._M_p[sVar4 - 1] != '.');
    std::__cxx11::string::string((string *)&local_58,param,sVar4,&local_59);
    lVar5 = 0;
    do {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_58,*(char **)((long)&rf_names[0].name + lVar5));
      if (iVar2 == 0) {
        if (sVar7 <= param->_M_string_length) {
          param->_M_string_length = sVar7;
          (param->_M_dataplus)._M_p[sVar7] = '\0';
          RVar6 = *(RESTResponseFormat *)((long)&rf_names[0].rf + lVar5);
          goto LAB_00289966;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar3 = std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase",sVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar3);
          }
        }
        goto LAB_002899fd;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    RVar6 = UNDEF;
LAB_00289966:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0028997d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return RVar6;
  }
LAB_002899fd:
  __stack_chk_fail();
}

Assistant:

RESTResponseFormat ParseDataFormat(std::string& param, const std::string& strReq)
{
    // Remove query string (if any, separated with '?') as it should not interfere with
    // parsing param and data format
    param = strReq.substr(0, strReq.rfind('?'));
    const std::string::size_type pos_format{param.rfind('.')};

    // No format string is found
    if (pos_format == std::string::npos) {
        return rf_names[0].rf;
    }

    // Match format string to available formats
    const std::string suffix(param, pos_format + 1);
    for (const auto& rf_name : rf_names) {
        if (suffix == rf_name.name) {
            param.erase(pos_format);
            return rf_name.rf;
        }
    }

    // If no suffix is found, return RESTResponseFormat::UNDEF and original string without query string
    return rf_names[0].rf;
}